

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O2

bool CheckBossDeath(AActor *actor)

{
  int *piVar1;
  AActor *this;
  PClass *pPVar2;
  PClass *pPVar3;
  long lVar4;
  bool bVar5;
  TThinkerIterator<AActor> iterator;
  FThinkerIterator FStack_38;
  
  piVar1 = &DAT_017dc018;
  lVar4 = 0;
  while( true ) {
    if (lVar4 == 8) {
      return false;
    }
    if ((playeringame[lVar4] == true) && (0 < *piVar1)) break;
    lVar4 = lVar4 + 1;
    piVar1 = piVar1 + 0xa8;
  }
  TThinkerIterator<AActor>::TThinkerIterator((TThinkerIterator<AActor> *)&FStack_38,0x80);
  do {
    do {
      this = (AActor *)FThinkerIterator::Next(&FStack_38,false);
      bVar5 = this == (AActor *)0x0;
      if (bVar5) {
        return bVar5;
      }
    } while ((this == actor) || ((this->health < 1 && (-1 < (int)(this->flags).Value))));
    pPVar2 = DObject::GetClass((DObject *)this);
    pPVar3 = DObject::GetClass((DObject *)actor);
  } while (pPVar2 != pPVar3);
  return bVar5;
}

Assistant:

bool CheckBossDeath (AActor *actor)
{
	int i;

	// make sure there is a player alive for victory
	for (i = 0; i < MAXPLAYERS; i++)
		if (playeringame[i] && players[i].health > 0)
			break;
	
	if (i == MAXPLAYERS)
		return false; // no one left alive, so do not end game
	
	// Make sure all bosses are dead
	TThinkerIterator<AActor> iterator;
	AActor *other;

	while ( (other = iterator.Next ()) )
	{
		if (other != actor &&
			(other->health > 0 || (other->flags & MF_ICECORPSE))
			&& other->GetClass() == actor->GetClass())
		{ // Found a living boss
		  // [RH] Frozen bosses don't count as dead until they shatter
			return false;
		}
	}
	// The boss death is good
	return true;
}